

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O1

DdNode * Llb_ImgComputeImage(Aig_Man_t *pAig,Vec_Ptr_t *vDdMans,DdManager *dd,DdNode *bInit,
                            Vec_Ptr_t *vQuant0,Vec_Ptr_t *vQuant1,Vec_Int_t *vDriRefs,
                            abctime TimeTarget,int fBackward,int fReorder,int fVerbose)

{
  ulong uVar1;
  DdManager *ddSource;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *n;
  long lVar9;
  int iVar10;
  ulong uVar11;
  timespec local_70;
  Vec_Ptr_t *local_60;
  long local_58;
  DdNode *local_50;
  Vec_Ptr_t *local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  local_40 = vQuant1;
  iVar3 = clock_gettime(3,&local_70);
  if (iVar3 < 0) {
    local_58 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_58 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  Cudd_Ref(bInit);
  if (fBackward == 0) {
    if (vQuant0->nSize < 1) goto LAB_008271ef;
    pDVar6 = Llb_ImgComputeCube(pAig,(Vec_Int_t *)*vQuant0->pArray,dd);
    Cudd_Ref(pDVar6);
    pDVar7 = Cudd_bddExistAbstract(dd,bInit,pDVar6);
    pVVar2 = vQuant0;
    if (pDVar7 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,bInit);
LAB_00827126:
      Cudd_RecursiveDeref(dd,pDVar6);
      return (DdNode *)0x0;
    }
  }
  else {
    local_60 = vQuant0;
    pDVar6 = Llb_DriverPhaseCube(pAig,vDriRefs,dd);
    Cudd_Ref(pDVar6);
    pDVar7 = Extra_bddChangePolarity(dd,bInit,pDVar6);
    pVVar2 = local_60;
  }
  local_60 = pVVar2;
  Cudd_Ref(pDVar7);
  Cudd_RecursiveDeref(dd,bInit);
  Cudd_RecursiveDeref(dd,pDVar6);
  if (0 < vDdMans->nSize) {
    uVar11 = 0;
    local_48 = vDdMans;
    do {
      ddSource = (DdManager *)vDdMans->pArray[uVar11];
      iVar3 = clock_gettime(3,&local_70);
      if (iVar3 < 0) {
        lVar9 = 1;
      }
      else {
        lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
        lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_70.tv_sec * -1000000;
      }
      if (fVerbose != 0) {
        printf("   %2d : ",uVar11 & 0xffffffff);
      }
      pDVar6 = Cudd_bddTransfer(ddSource,dd,ddSource->bFunc);
      if (pDVar6 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      local_38 = lVar9;
      Cudd_Ref(pDVar6);
      if (fVerbose != 0) {
        uVar4 = Cudd_DagSize(ddSource->bFunc);
        uVar5 = Cudd_DagSize(pDVar6);
        printf("Pt0 =%6d. Pt1 =%6d. ",(ulong)uVar4,(ulong)uVar5);
      }
      uVar1 = uVar11 + 1;
      if ((long)local_40->nSize <= (long)uVar1) goto LAB_008271ef;
      pDVar8 = Llb_ImgComputeCube(pAig,(Vec_Int_t *)local_40->pArray[uVar11 + 1],dd);
      Cudd_Ref(pDVar8);
      n = Cudd_bddAndAbstract(dd,pDVar7,pDVar6,pDVar8);
      if (n == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar7);
        Cudd_RecursiveDeref(dd,pDVar8);
        goto LAB_00827126;
      }
      Cudd_Ref(n);
      local_50 = n;
      if (fVerbose == 0) {
        Cudd_RecursiveDeref(dd,pDVar7);
        Cudd_RecursiveDeref(dd,pDVar8);
        pDVar7 = local_50;
        Cudd_RecursiveDeref(dd,pDVar6);
        vDdMans = local_48;
      }
      else {
        uVar4 = Cudd_DagSize(pDVar7);
        uVar5 = Cudd_DagSize(n);
        printf("Im0 =%6d. Im1 =%6d. ",(ulong)uVar4,(ulong)uVar5);
        Cudd_RecursiveDeref(dd,pDVar7);
        Cudd_RecursiveDeref(dd,pDVar8);
        Cudd_RecursiveDeref(dd,pDVar6);
        pDVar7 = local_50;
        uVar4 = Cudd_SupportSize(dd,local_50);
        printf("Supp =%3d. ",(ulong)uVar4);
        vDdMans = local_48;
        iVar10 = 3;
        iVar3 = clock_gettime(3,&local_70);
        if (iVar3 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        lVar9 = lVar9 + local_38;
        Abc_Print(iVar10,"%s =","T");
        Abc_Print(iVar10,"%9.2f sec\n",(double)lVar9 / 1000000.0);
      }
      uVar11 = uVar1;
    } while ((long)uVar1 < (long)vDdMans->nSize);
  }
  if (fBackward == 0) {
    pDVar6 = Llb_DriverPhaseCube(pAig,vDriRefs,dd);
    Cudd_Ref(pDVar6);
    pDVar8 = Extra_bddChangePolarity(dd,pDVar7,pDVar6);
  }
  else {
    if (local_60->nSize < 1) {
LAB_008271ef:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pDVar6 = Llb_ImgComputeCube(pAig,(Vec_Int_t *)*local_60->pArray,dd);
    Cudd_Ref(pDVar6);
    pDVar8 = Cudd_bddExistAbstract(dd,pDVar7,pDVar6);
  }
  Cudd_Ref(pDVar8);
  Cudd_RecursiveDeref(dd,pDVar7);
  Cudd_RecursiveDeref(dd,pDVar6);
  if (fReorder != 0) {
    if (fVerbose == 0) {
      Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    }
    else {
      pDVar7 = pDVar8;
      uVar4 = Cudd_DagSize(pDVar8);
      Abc_Print((int)pDVar7,"        Reordering... Before =%5d. ",(ulong)uVar4);
      Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
      pDVar7 = pDVar8;
      uVar4 = Cudd_DagSize(pDVar8);
      Abc_Print((int)pDVar7,"After =%5d. ",(ulong)uVar4);
      iVar10 = 3;
      iVar3 = clock_gettime(3,&local_70);
      if (iVar3 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      lVar9 = lVar9 + local_58;
      Abc_Print(iVar10,"%s =","Time");
      Abc_Print(iVar10,"%9.2f sec\n",(double)lVar9 / 1000000.0);
    }
  }
  Cudd_Deref(pDVar8);
  return pDVar8;
}

Assistant:

DdNode * Llb_ImgComputeImage( Aig_Man_t * pAig, Vec_Ptr_t * vDdMans, DdManager * dd, DdNode * bInit, 
    Vec_Ptr_t * vQuant0, Vec_Ptr_t * vQuant1, Vec_Int_t * vDriRefs, 
    abctime TimeTarget, int fBackward, int fReorder, int fVerbose )
{
//    int fCheckSupport = 0;
    DdManager * ddPart;
    DdNode * bImage, * bGroup, * bCube, * bTemp;
    int i;
    abctime clk, clk0 = Abc_Clock();

    bImage = bInit;  Cudd_Ref( bImage );
    if ( fBackward )
    {
        // change polarity
        bCube  = Llb_DriverPhaseCube( pAig, vDriRefs, dd );                Cudd_Ref( bCube );
        bImage = Extra_bddChangePolarity( dd, bTemp = bImage, bCube );     Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else
    {
        // quantify unique vriables
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, 0), dd ); Cudd_Ref( bCube );
        bImage = Cudd_bddExistAbstract( dd, bTemp = bImage, bCube );                    
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    // perform image computation
    Vec_PtrForEachEntry( DdManager *, vDdMans, ddPart, i )
    {
        clk = Abc_Clock();
if ( fVerbose )
printf( "   %2d : ", i );
        // transfer the BDD from the group manager to the main manager
        bGroup = Cudd_bddTransfer( ddPart, dd, ddPart->bFunc );                           
        if ( bGroup == NULL )
            return NULL;
        Cudd_Ref( bGroup );
if ( fVerbose )
printf( "Pt0 =%6d. Pt1 =%6d. ", Cudd_DagSize(ddPart->bFunc), Cudd_DagSize(bGroup) );
        // perform partial product
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant1, i+1), dd ); Cudd_Ref( bCube );
//        bImage = Cudd_bddAndAbstract( dd, bTemp = bImage, bGroup, bCube );                
//        bImage = Extra_bddAndAbstractTime( dd, bTemp = bImage, bGroup, bCube, TimeTarget );  
        bImage = Cudd_bddAndAbstract( dd, bTemp = bImage, bGroup, bCube );  
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            Cudd_RecursiveDeref( dd, bGroup );
            return NULL;
        }
        Cudd_Ref( bImage );

if ( fVerbose )
printf( "Im0 =%6d. Im1 =%6d. ", Cudd_DagSize(bTemp), Cudd_DagSize(bImage) );
//printf("\n"); Extra_bddPrintSupport(dd, bImage); printf("\n");
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        Cudd_RecursiveDeref( dd, bGroup );

//        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
//        Abc_Print( 1, "Reo =%6d.  ", Cudd_DagSize(bImage) );

if ( fVerbose )
printf( "Supp =%3d. ", Cudd_SupportSize(dd, bImage) );
if ( fVerbose )
Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    }

    if ( !fBackward )
    {
        // change polarity
        bCube  = Llb_DriverPhaseCube( pAig, vDriRefs, dd );                Cudd_Ref( bCube );
        bImage = Extra_bddChangePolarity( dd, bTemp = bImage, bCube );     Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else
    {
        // quantify unique vriables
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, 0), dd ); Cudd_Ref( bCube );
        bImage = Cudd_bddExistAbstract( dd, bTemp = bImage, bCube );                    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }

    if ( fReorder )
    {
    if ( fVerbose )
    Abc_Print( 1, "        Reordering... Before =%5d. ", Cudd_DagSize(bImage) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
    Abc_Print( 1, "After =%5d. ", Cudd_DagSize(bImage) );
//    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
//    Abc_Print( 1, "After =%5d.  ", Cudd_DagSize(bImage) );
    if ( fVerbose )
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk0 );
//    Abc_Print( 1, "\n" );
    }

    Cudd_Deref( bImage );
    return bImage;
}